

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O3

void filetree_get_file_size(gpointer user,gpointer user_data)

{
  int iVar1;
  __off_t *p_Var2;
  GStatBuf stat_buf;
  stat local_a0;
  
  p_Var2 = (__off_t *)g_malloc(8);
  *(__off_t **)((long)user + 8) = p_Var2;
  iVar1 = stat((char *)**user,&local_a0);
  if (iVar1 != 0) {
    local_a0.st_size = 0;
  }
  *p_Var2 = local_a0.st_size;
  return;
}

Assistant:

void filetree_get_file_size(gpointer user, gpointer user_data)
{
#if GLIB_CHECK_VERSION(2, 25, 0)
    GStatBuf stat_buf;
#else
    struct stat stat_buf;
#endif
    struct filename_list_node *fln = (struct filename_list_node *) user;
    guint64 *file_size;

    (void) user_data;
    fln->d = g_malloc(sizeof(guint64));
    file_size = (guint64 *) fln->d;
    if (g_stat(fln->fr->raw, &stat_buf)) {
        *file_size = 0;
    } else {
        *file_size = (guint64) stat_buf.st_size;
    }
}